

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

PackageMempoolAcceptResult *
ProcessNewPackage(PackageMempoolAcceptResult *__return_storage_ptr__,Chainstate *active_chainstate,
                 CTxMemPool *pool,Package *package,bool test_accept,
                 optional<CFeeRate> *client_maxfeerate)

{
  string *psVar1;
  int64_t *piVar2;
  TxValidationResult TVar3;
  long lVar4;
  CChainParams *pCVar5;
  pointer psVar6;
  element_type *peVar7;
  pointer pCVar8;
  CTxIn *pCVar9;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  PackageValidationState state;
  PackageValidationState state_00;
  PackageValidationState state_01;
  PackageValidationState state_02;
  TxValidationState state_03;
  TxValidationState state_04;
  PackageValidationState state_05;
  COutPoint *pCVar15;
  undefined1 uVar16;
  undefined7 uVar17;
  bool bVar18;
  int32_t iVar19;
  pointer psVar20;
  int64_t iVar21;
  CTxMemPoolEntry *pCVar22;
  CTxMemPoolEntry **ppCVar23;
  mapped_type *pmVar24;
  undefined8 extraout_RAX;
  size_type sVar25;
  iterator iVar26;
  CCoinsViewCache *pCVar27;
  long lVar28;
  COutPoint *hashTx;
  Txid *txid;
  Wtxid *pWVar29;
  COutPoint *hash;
  pointer psVar30;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *__x;
  long lVar31;
  ValidationState<TxValidationResult> *this;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> _Var32;
  CTxIn *input;
  pointer outpoint;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> __it;
  long in_FS_OFFSET;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  undefined8 uStack_788;
  undefined8 local_770;
  undefined4 uStack_760;
  uint local_75c;
  vector<COutPoint,_std::allocator<COutPoint>_> coins_to_uncache;
  allocator<char> local_73a;
  allocator<char> local_739;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  txns_package_eval;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  unconfirmed_parent_txids;
  ATMPArgs local_6d0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  BlockValidationState state_dummy;
  CCoinsView local_408;
  Chainstate *local_400;
  ValidationState<TxValidationResult> local_388;
  ValidationState<TxValidationResult> local_340;
  string local_2f8;
  TxValidationState mempool_full_state;
  ValidationState<PackageValidationResult> local_290;
  PackageMempoolAcceptResult multi_submission_result;
  ATMPArgs args;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_180 [3];
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  individual_results_nonfinal;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results_final;
  PackageValidationState package_state_quit_early;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  psVar20 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar30 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar20 == psVar30) {
    __assert_fail("!package.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x764,
                  "PackageMempoolAcceptResult ProcessNewPackage(Chainstate &, CTxMemPool &, const Package &, bool, const std::optional<CFeeRate> &)"
                 );
  }
  lVar28 = (long)psVar30 - (long)psVar20;
  for (lVar31 = lVar28 >> 6; 0 < lVar31; lVar31 = lVar31 + -1) {
    if ((psVar20->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) goto LAB_0035ce66;
    if (psVar20[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar20 = psVar20 + 1;
      goto LAB_0035ce66;
    }
    if (psVar20[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar20 = psVar20 + 2;
      goto LAB_0035ce66;
    }
    if (psVar20[3].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar20 = psVar20 + 3;
      goto LAB_0035ce66;
    }
    psVar20 = psVar20 + 4;
    lVar28 = lVar28 + -0x40;
  }
  lVar28 = lVar28 >> 4;
  if (lVar28 == 1) {
LAB_0035ce4c:
    if ((psVar20->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar20 = psVar30;
    }
LAB_0035ce66:
    if (psVar20 != psVar30) {
      __assert_fail("std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;})"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                    ,0x765,
                    "PackageMempoolAcceptResult ProcessNewPackage(Chainstate &, CTxMemPool &, const Package &, bool, const std::optional<CFeeRate> &)"
                   );
    }
  }
  else {
    if (lVar28 == 2) {
LAB_0035ce42:
      if ((psVar20->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        psVar20 = psVar20 + 1;
        goto LAB_0035ce4c;
      }
      goto LAB_0035ce66;
    }
    if (lVar28 == 3) {
      if ((psVar20->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        psVar20 = psVar20 + 1;
        goto LAB_0035ce42;
      }
      goto LAB_0035ce66;
    }
  }
  coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar5 = (active_chainstate->m_chainman->m_options).chainparams;
  if (test_accept) {
    iVar21 = GetTime();
    args.m_chainparams._0_1_ = SUB81(pCVar5,0);
    args.m_chainparams._1_7_ = (undefined7)((ulong)pCVar5 >> 8);
    args.m_accept_time._0_1_ = (undefined1)iVar21;
    args.m_accept_time._1_7_ = SUB87((ulong)iVar21 >> 8,0);
    args.m_bypass_limits = false;
    args.m_coins_to_uncache._0_1_ = SUB81(&coins_to_uncache,0);
    args.m_coins_to_uncache._1_7_ = (undefined7)((ulong)&coins_to_uncache >> 8);
    args.m_test_accept = true;
    args.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_engaged = false;
    args.m_allow_replacement = false;
    args.m_allow_sibling_eviction = false;
    args.m_package_submission = false;
    args.m_package_feerates = false;
    args.m_allow_carveouts = false;
    anon_unknown.dwarf_c1a4f9::MemPoolAccept::MemPoolAccept
              ((MemPoolAccept *)&state_dummy,pool,active_chainstate);
    anon_unknown.dwarf_c1a4f9::MemPoolAccept::AcceptMultipleTransactions
              (__return_storage_ptr__,(MemPoolAccept *)&state_dummy,package,&args);
    anon_unknown.dwarf_c1a4f9::MemPoolAccept::~MemPoolAccept((MemPoolAccept *)&state_dummy);
    hash = coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
    pCVar15 = coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    local_6d0.m_accept_time = GetTime();
    local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK =
         *(CFeeRate *)
          &(client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
           super__Optional_payload_base<CFeeRate>._M_payload;
    local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_engaged =
         (client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
         super__Optional_payload_base<CFeeRate>._M_engaged;
    local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._9_7_ =
         *(undefined7 *)
          &(client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
           super__Optional_payload_base<CFeeRate>.field_0x9;
    local_6d0.m_bypass_limits = false;
    local_6d0.m_coins_to_uncache = &coins_to_uncache;
    local_6d0.m_test_accept = false;
    local_6d0.m_allow_replacement = true;
    local_6d0.m_allow_sibling_eviction = false;
    local_6d0.m_package_submission = true;
    local_6d0.m_package_feerates = true;
    local_6d0.m_allow_carveouts = false;
    local_6d0.m_chainparams = pCVar5;
    anon_unknown.dwarf_c1a4f9::MemPoolAccept::MemPoolAccept
              ((MemPoolAccept *)&state_dummy,pool,active_chainstate);
    package_state_quit_early.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         (pointer)&package_state_quit_early.super_ValidationState<PackageValidationResult>.
                   m_reject_reason.field_2;
    package_state_quit_early.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
    package_state_quit_early.super_ValidationState<PackageValidationResult>.m_result =
         PCKG_RESULT_UNSET;
    package_state_quit_early.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = 0;
    package_state_quit_early.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_local_buf[0] = '\0';
    package_state_quit_early.super_ValidationState<PackageValidationResult>.m_debug_message.
    _M_dataplus._M_p =
         (pointer)&package_state_quit_early.super_ValidationState<PackageValidationResult>.
                   m_debug_message.field_2;
    package_state_quit_early.super_ValidationState<PackageValidationResult>.m_debug_message.
    _M_string_length = 0;
    package_state_quit_early.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_local_buf[0] = '\0';
    bVar18 = IsWellFormedPackage(package,&package_state_quit_early,true);
    if (bVar18) {
      bVar18 = IsChildWithParents(package);
      if (!bVar18) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&args,"package-not-child-with-parents",
                   (allocator<char> *)&unconfirmed_parent_txids);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&multi_submission_result,"",(allocator<char> *)&local_290);
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state_quit_early.super_ValidationState<PackageValidationResult>,
                   PCKG_POLICY,(string *)&args,(string *)&multi_submission_result);
        std::__cxx11::string::~string((string *)&multi_submission_result);
        std::__cxx11::string::~string((string *)&args);
        ValidationState<PackageValidationResult>::ValidationState
                  ((ValidationState<PackageValidationResult> *)&args,
                   &package_state_quit_early.super_ValidationState<PackageValidationResult>);
        psVar1 = &multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
                  m_reject_reason;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_
             = M_VALID;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>._1_7_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason._M_dataplus._M_p._0_1_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason._M_dataplus._M_p._1_7_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason._M_string_length._0_1_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason._M_string_length._1_7_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason.field_2._M_local_buf[0] = (char)psVar1;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)psVar1 >> 8);
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_debug_message._M_dataplus._M_p = (pointer)0x0;
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)active_chainstate;
        state_00.super_ValidationState<PackageValidationResult>._0_8_ = uStack_788;
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)package;
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = local_770;
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             __return_storage_ptr__;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _0_4_ = uStack_760;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _4_4_ = local_75c;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_start;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity =
             (size_type)
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_finish;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason.field_2._M_local_buf[8] =
             multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason.field_2._M_local_buf[0];
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason.field_2._9_7_ =
             multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason.field_2._M_allocated_capacity._1_7_;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_00,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)&args);
        goto LAB_0035d18d;
      }
      psVar20 = (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)psVar20 -
                 (long)(package->
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x11) {
        __assert_fail("package.size() > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x6a7,
                      "PackageMempoolAcceptResult (anonymous namespace)::MemPoolAccept::AcceptPackage(const Package &, ATMPArgs &)"
                     );
      }
      std::
      _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_Hashtable(&unconfirmed_parent_txids._M_h);
      psVar30 = (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar6 = (package->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_ =
           SUB81(&unconfirmed_parent_txids._M_h,0);
      uVar16 = (undefined1)
               multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_mode
      ;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>._1_7_ =
           SUB87((ulong)&unconfirmed_parent_txids._M_h >> 8,0);
      uVar17 = multi_submission_result.m_state.super_ValidationState<PackageValidationResult>._1_7_;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      ._M_dataplus._M_p._0_1_ = 0;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      ._M_dataplus._M_p._1_7_ = 0;
      for (; psVar30 != psVar6 + -1; psVar30 = psVar30 + 1) {
        peVar7 = (psVar30->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        uVar11 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar12 = *(undefined8 *)
                  ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar13 = *(undefined8 *)
                  ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar14 = *(undefined8 *)
                  ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        args.m_bypass_limits = SUB81(uVar13,0);
        args._17_7_ = SUB87((ulong)uVar13 >> 8,0);
        args.m_coins_to_uncache._0_1_ = (undefined1)uVar14;
        args.m_coins_to_uncache._1_7_ = (undefined7)((ulong)uVar14 >> 8);
        args.m_chainparams._0_1_ = (undefined1)uVar11;
        args.m_chainparams._1_7_ = (undefined7)((ulong)uVar11 >> 8);
        args.m_accept_time._0_1_ = (undefined1)uVar12;
        args.m_accept_time._1_7_ = SUB87((ulong)uVar12 >> 8,0);
        std::
        insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
        ::operator=((insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
                     *)&multi_submission_result,(value_type *)&args);
      }
      pCVar27 = Chainstate::CoinsTip(local_400);
      peVar7 = psVar20[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pCVar8 = (peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (outpoint = (peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start; outpoint != pCVar8; outpoint = outpoint + 1)
      {
        bVar18 = CCoinsViewCache::HaveCoinInCache(pCVar27,&outpoint->prevout);
        if (!bVar18) {
          std::vector<COutPoint,_std::allocator<COutPoint>_>::push_back
                    (local_6d0.m_coins_to_uncache,&outpoint->prevout);
        }
      }
      pCVar27 = Chainstate::CoinsTip(local_400);
      CCoinsViewBacked::SetBackend
                ((CCoinsViewBacked *)
                 &state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason,
                 (CCoinsView *)pCVar27);
      peVar7 = psVar20[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      __it._M_current =
           (peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
      pCVar9 = (peVar7->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      args.m_chainparams._0_1_ = SUB81(&state_dummy,0);
      args.m_chainparams._1_7_ = (undefined7)((ulong)&state_dummy >> 8);
      lVar28 = (long)pCVar9 - (long)__it._M_current;
      args.m_accept_time._0_1_ = uVar16;
      args.m_accept_time._1_7_ = uVar17;
      for (lVar31 = lVar28 / 0x68 >> 2; _Var32._M_current = __it._M_current, 0 < lVar31;
          lVar31 = lVar31 + -1) {
        bVar18 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)&args,__it);
        if (bVar18) goto LAB_0035d333;
        bVar18 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)&args,__it._M_current + 1);
        _Var32._M_current = __it._M_current + 1;
        if (bVar18) goto LAB_0035d333;
        bVar18 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)&args,__it._M_current + 2);
        _Var32._M_current = __it._M_current + 2;
        if (bVar18) goto LAB_0035d333;
        bVar18 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)&args,__it._M_current + 3);
        _Var32._M_current = __it._M_current + 3;
        if (bVar18) goto LAB_0035d333;
        __it._M_current = __it._M_current + 4;
        lVar28 = lVar28 + -0x1a0;
      }
      lVar28 = lVar28 / 0x68;
      if (lVar28 == 1) {
LAB_0035ddfb:
        bVar18 = __gnu_cxx::__ops::
                 _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                 ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                               *)&args,__it);
        _Var32._M_current = __it._M_current;
        if (!bVar18) {
          _Var32._M_current = pCVar9;
        }
LAB_0035d333:
        if (_Var32._M_current == pCVar9) goto LAB_0035d41d;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&args,"package-not-child-with-unconfirmed-parents",
                   (allocator<char> *)&local_290);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&multi_submission_result,"",(allocator<char> *)&mempool_full_state);
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state_quit_early.super_ValidationState<PackageValidationResult>,
                   PCKG_POLICY,(string *)&args,(string *)&multi_submission_result);
        std::__cxx11::string::~string((string *)&multi_submission_result);
        std::__cxx11::string::~string((string *)&args);
        ValidationState<PackageValidationResult>::ValidationState
                  ((ValidationState<PackageValidationResult> *)&args,
                   &package_state_quit_early.super_ValidationState<PackageValidationResult>);
        psVar1 = &multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
                  m_reject_reason;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_
             = M_VALID;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>._1_7_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason._M_dataplus._M_p._0_1_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason._M_dataplus._M_p._1_7_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason._M_string_length._0_1_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason._M_string_length._1_7_ = 0;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason.field_2._M_local_buf[0] = (char)psVar1;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)psVar1 >> 8);
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_debug_message._M_dataplus._M_p = (pointer)0x0;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)active_chainstate;
        state_01.super_ValidationState<PackageValidationResult>._0_8_ = uStack_788;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)package;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)pCVar9;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             __return_storage_ptr__;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _0_4_ = uStack_760;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _4_4_ = local_75c;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_start;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity =
             (size_type)
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_finish;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason.field_2._M_local_buf[8] =
             multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason.field_2._M_local_buf[0];
        multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
        m_reject_reason.field_2._9_7_ =
             multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
             m_reject_reason.field_2._M_allocated_capacity._1_7_;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_01,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)&args);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)&multi_submission_result);
        ValidationState<PackageValidationResult>::~ValidationState
                  ((ValidationState<PackageValidationResult> *)&args);
      }
      else {
        if (lVar28 == 2) {
LAB_0035d305:
          bVar18 = __gnu_cxx::__ops::
                   _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                   ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                                 *)&args,__it);
          _Var32._M_current = __it._M_current;
          if (!bVar18) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0035ddfb;
          }
          goto LAB_0035d333;
        }
        if (lVar28 == 3) {
          bVar18 = __gnu_cxx::__ops::
                   _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                   ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                                 *)&args,__it);
          if (!bVar18) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0035d305;
          }
          goto LAB_0035d333;
        }
LAB_0035d41d:
        CCoinsViewBacked::SetBackend
                  ((CCoinsViewBacked *)
                   &state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason,
                   &local_408);
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  (&criticalblock9,
                   (AnnotatedMixin<std::recursive_mutex> *)
                   (state_dummy.super_ValidationState<BlockValidationResult>._0_8_ + 0x58),
                   "m_pool.cs",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                   ,0x6ca,false);
        results_final._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &results_final._M_t._M_impl.super__Rb_tree_header._M_header;
        results_final._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        results_final._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        results_final._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        individual_results_nonfinal._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &individual_results_nonfinal._M_t._M_impl.super__Rb_tree_header._M_header;
        individual_results_nonfinal._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        individual_results_nonfinal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        individual_results_nonfinal._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        txns_package_eval.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        txns_package_eval.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        txns_package_eval.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __x = &((package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
        p_Var10 = &((package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
        local_75c = 0;
        individual_results_nonfinal._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             individual_results_nonfinal._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        results_final._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             results_final._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (; __x != p_Var10; __x = __x + 1) {
          peVar7 = __x->_M_ptr;
          args.m_chainparams._0_1_ = 1;
          uVar11 = *(undefined8 *)
                    (peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar12 = *(undefined8 *)
                    ((peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          uVar13 = *(undefined8 *)
                    ((peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                    );
          uVar14 = *(undefined8 *)
                    ((peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                    );
          args._17_7_ = SUB87(uVar13,0);
          args.m_coins_to_uncache._0_1_ = (undefined1)((ulong)uVar13 >> 0x38);
          args.m_coins_to_uncache._1_7_ = (undefined7)uVar14;
          args.m_test_accept = SUB81((ulong)uVar14 >> 0x38,0);
          args.m_chainparams._1_7_ = (undefined7)uVar11;
          args.m_accept_time._0_1_ = (undefined1)((ulong)uVar11 >> 0x38);
          args.m_accept_time._1_7_ = SUB87(uVar12,0);
          args.m_bypass_limits = SUB81((ulong)uVar12 >> 0x38,0);
          bVar18 = CTxMemPool::exists((CTxMemPool *)
                                      state_dummy.super_ValidationState<BlockValidationResult>._0_8_
                                      ,(GenTxid *)&args);
          pWVar29 = &peVar7->m_witness_hash;
          txid = &peVar7->hash;
          if (bVar18) {
            pCVar22 = CTxMemPool::GetEntry
                                ((CTxMemPool *)
                                 state_dummy.super_ValidationState<BlockValidationResult>._0_8_,txid
                                );
            args.m_chainparams._0_1_ = SUB81(pCVar22,0);
            args.m_chainparams._1_7_ = (undefined7)((ulong)pCVar22 >> 8);
            ppCVar23 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                                 ((CTxMemPoolEntry **)&args,
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                  ,0x6e4,"AcceptPackage","m_pool.GetEntry(txid)");
            pCVar22 = *ppCVar23;
            iVar19 = CTxMemPoolEntry::GetTxSize(pCVar22);
            MempoolAcceptResult::MempoolAcceptResult
                      ((MempoolAcceptResult *)&args,(long)iVar19,pCVar22->nFee);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&results_final,pWVar29,(MempoolAcceptResult *)&args);
LAB_0035d63b:
            MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&args);
          }
          else {
            args.m_chainparams._0_1_ = 0;
            uVar11 = *(undefined8 *)(txid->m_wrapped).super_base_blob<256U>.m_data._M_elems;
            uVar12 = *(undefined8 *)
                      ((peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar13 = *(undefined8 *)
                      ((peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            uVar14 = *(undefined8 *)
                      ((peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            args._17_7_ = SUB87(uVar13,0);
            args.m_coins_to_uncache._0_1_ = (undefined1)((ulong)uVar13 >> 0x38);
            args.m_coins_to_uncache._1_7_ = (undefined7)uVar14;
            args.m_test_accept = SUB81((ulong)uVar14 >> 0x38,0);
            args.m_chainparams._1_7_ = (undefined7)uVar11;
            args.m_accept_time._0_1_ = (undefined1)((ulong)uVar11 >> 0x38);
            args.m_accept_time._1_7_ = SUB87(uVar12,0);
            args.m_bypass_limits = SUB81((ulong)uVar12 >> 0x38,0);
            bVar18 = CTxMemPool::exists((CTxMemPool *)
                                        state_dummy.super_ValidationState<BlockValidationResult>.
                                        _0_8_,(GenTxid *)&args);
            if (bVar18) {
              pCVar22 = CTxMemPool::GetEntry
                                  ((CTxMemPool *)
                                   state_dummy.super_ValidationState<BlockValidationResult>._0_8_,
                                   txid);
              args.m_chainparams._0_1_ = SUB81(pCVar22,0);
              args.m_chainparams._1_7_ = (undefined7)((ulong)pCVar22 >> 8);
              ppCVar23 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                                   ((CTxMemPoolEntry **)&args,
                                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                    ,0x6ee,"AcceptPackage","m_pool.GetEntry(txid)");
              MempoolAcceptResult::MempoolAcceptResult
                        ((MempoolAcceptResult *)&args,
                         &((((*ppCVar23)->tx).
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_witness_hash).m_wrapped);
              std::
              _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                        ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                          *)&results_final,pWVar29,(MempoolAcceptResult *)&args);
              goto LAB_0035d63b;
            }
            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_290,
                       __x);
            __l._M_len = 1;
            __l._M_array = (iterator)&local_290;
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)&multi_submission_result,__l,(allocator_type *)&mempool_full_state);
            anon_unknown.dwarf_c1a4f9::MemPoolAccept::AcceptSubPackage
                      ((PackageMempoolAcceptResult *)&args,(MemPoolAccept *)&state_dummy,
                       (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)&multi_submission_result,&local_6d0);
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)&multi_submission_result);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_290.m_reject_reason);
            pmVar24 = std::
                      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      ::at(local_180,&pWVar29->m_wrapped);
            if (pmVar24->m_result_type == VALID) {
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_mode.
              _0_1_ = M_INVALID;
              uVar11 = *(undefined8 *)(pWVar29->m_wrapped).super_base_blob<256U>.m_data._M_elems;
              uVar12 = *(undefined8 *)
                        ((peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        8);
              uVar13 = *(undefined8 *)
                        ((peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x10);
              uVar14 = *(undefined8 *)
                        ((peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x18);
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_string_length._1_7_ = (undefined7)uVar13;
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason.field_2._M_local_buf[0] = (char)((ulong)uVar13 >> 0x38);
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason.field_2._M_allocated_capacity._1_7_ = (undefined7)uVar14;
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason.field_2._M_local_buf[8] = (char)((ulong)uVar14 >> 0x38);
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>._1_7_ =
                   SUB87(uVar11,0);
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_dataplus._M_p._0_1_ = (undefined1)((ulong)uVar11 >> 0x38);
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_dataplus._M_p._1_7_ = (undefined7)uVar12;
              multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_string_length._0_1_ = (undefined1)((ulong)uVar12 >> 0x38);
              bVar18 = CTxMemPool::exists((CTxMemPool *)
                                          state_dummy.super_ValidationState<BlockValidationResult>.
                                          _0_8_,(GenTxid *)&multi_submission_result);
              if (!bVar18) {
                __assert_fail("m_pool.exists(GenTxid::Wtxid(wtxid))",
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                              ,0x6f9,
                              "PackageMempoolAcceptResult (anonymous namespace)::MemPoolAccept::AcceptPackage(const Package &, ATMPArgs &)"
                             );
              }
              std::
              _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                        ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                          *)&results_final,pWVar29,pmVar24);
            }
            else {
              TVar3 = (pmVar24->m_state).super_ValidationState<TxValidationResult>.m_result;
              if ((TVar3 == TX_MISSING_INPUTS) || (TVar3 == TX_RECONSIDERABLE)) {
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&individual_results_nonfinal,pWVar29,pmVar24);
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::push_back(&txns_package_eval,(value_type *)__x);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&multi_submission_result,"transaction failed",
                           (allocator<char> *)&mempool_full_state);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_290,"",(allocator<char> *)&local_340);
                ValidationState<PackageValidationResult>::Invalid
                          (&package_state_quit_early.super_ValidationState<PackageValidationResult>,
                           PCKG_TX,(string *)&multi_submission_result,(string *)&local_290);
                std::__cxx11::string::~string((string *)&local_290);
                std::__cxx11::string::~string((string *)&multi_submission_result);
                local_75c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&individual_results_nonfinal,pWVar29,pmVar24);
              }
            }
            PackageMempoolAcceptResult::~PackageMempoolAcceptResult
                      ((PackageMempoolAcceptResult *)&args);
          }
        }
        if (((local_75c & 1) == 0) &&
           (txns_package_eval.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            txns_package_eval.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          anon_unknown.dwarf_c1a4f9::MemPoolAccept::AcceptSubPackage
                    (&multi_submission_result,(MemPoolAccept *)&state_dummy,&txns_package_eval,
                     &local_6d0);
        }
        else {
          ValidationState<PackageValidationResult>::ValidationState
                    (&local_290,
                     &package_state_quit_early.super_ValidationState<PackageValidationResult>);
          piVar2 = &args.m_accept_time;
          args.m_chainparams._0_1_ = 0;
          args.m_chainparams._1_7_ = 0;
          args.m_accept_time._0_1_ = M_VALID;
          args.m_accept_time._1_7_ = 0;
          args.m_bypass_limits = false;
          args._17_7_ = 0;
          args.m_coins_to_uncache._0_1_ = SUB81(piVar2,0);
          args.m_coins_to_uncache._1_7_ = (undefined7)((ulong)piVar2 >> 8);
          args._33_4_ = SUB84((ulong)piVar2 >> 8,0);
          args._37_3_ = SUB83((ulong)piVar2 >> 0x28,0);
          args.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
          super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)0x0;
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)active_chainstate;
          state_02.super_ValidationState<PackageValidationResult>._0_8_ = uStack_788;
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
               (size_type)package;
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)p_Var10;
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
               __return_storage_ptr__;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
          _0_4_ = uStack_760;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
          _4_4_ = local_75c;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
               (size_type)
               coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
               super__Vector_impl_data._M_start;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity =
               (size_type)
               coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          args.m_test_accept = (bool)args.m_coins_to_uncache._0_1_;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (&multi_submission_result,state_02,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)&local_290);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)&args);
          ValidationState<PackageValidationResult>::~ValidationState(&local_290);
        }
        uVar11 = state_dummy.super_ValidationState<BlockValidationResult>._0_8_;
        pCVar27 = Chainstate::CoinsTip(local_400);
        LimitMempoolSize((CTxMemPool *)uVar11,pCVar27);
        psVar30 = (package->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (psVar20 = (package->
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; psVar20 != psVar30;
            psVar20 = psVar20 + 1) {
          peVar7 = (psVar20->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          pWVar29 = &peVar7->m_witness_hash;
          sVar25 = std::
                   map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   ::count(&multi_submission_result.m_tx_results,&pWVar29->m_wrapped);
          if (sVar25 == 0) {
            iVar26 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     ::find(&results_final._M_t,&pWVar29->m_wrapped);
            if ((_Rb_tree_header *)iVar26._M_node ==
                &results_final._M_t._M_impl.super__Rb_tree_header) {
              iVar26 = std::
                       _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       ::find(&individual_results_nonfinal._M_t,&pWVar29->m_wrapped);
              if ((_Rb_tree_header *)iVar26._M_node !=
                  &individual_results_nonfinal._M_t._M_impl.super__Rb_tree_header) {
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult&>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results_final,pWVar29,(MempoolAcceptResult *)(iVar26._M_node + 2));
              }
            }
            else {
              std::
              map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::count(&individual_results_nonfinal,&pWVar29->m_wrapped);
              peVar7 = (psVar20->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              args.m_chainparams._0_1_ = 0;
              uVar11 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar12 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar13 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar14 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              args._17_7_ = SUB87(uVar13,0);
              args.m_coins_to_uncache._0_1_ = (undefined1)((ulong)uVar13 >> 0x38);
              args.m_coins_to_uncache._1_7_ = (undefined7)uVar14;
              args.m_test_accept = SUB81((ulong)uVar14 >> 0x38,0);
              args.m_chainparams._1_7_ = (undefined7)uVar11;
              args.m_accept_time._0_1_ = (undefined1)((ulong)uVar11 >> 0x38);
              args.m_accept_time._1_7_ = SUB87(uVar12,0);
              args.m_bypass_limits = SUB81((ulong)uVar12 >> 0x38,0);
              bVar18 = CTxMemPool::exists((CTxMemPool *)
                                          state_dummy.super_ValidationState<BlockValidationResult>.
                                          _0_8_,(GenTxid *)&args);
              if (!bVar18) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&args,"transaction failed",(allocator<char> *)&local_2f8);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&mempool_full_state,"",&local_739);
                ValidationState<PackageValidationResult>::Invalid
                          ((ValidationState<PackageValidationResult> *)&multi_submission_result,
                           PCKG_TX,(string *)&args,(string *)&mempool_full_state);
                std::__cxx11::string::~string((string *)&mempool_full_state);
                std::__cxx11::string::~string((string *)&args);
                mempool_full_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_result =
                     TX_RESULT_UNSET;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                _M_dataplus._M_p =
                     (pointer)&mempool_full_state.super_ValidationState<TxValidationResult>.
                               m_reject_reason.field_2;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                _M_string_length = 0;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2
                ._M_local_buf[0] = '\0';
                mempool_full_state.super_ValidationState<TxValidationResult>.m_debug_message.
                _M_dataplus._M_p =
                     (pointer)&mempool_full_state.super_ValidationState<TxValidationResult>.
                               m_debug_message.field_2;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_debug_message.
                _M_string_length = 0;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2
                ._M_local_buf[0] = '\0';
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&args,"mempool full",&local_739);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f8,"",&local_73a);
                ValidationState<TxValidationResult>::Invalid
                          (&mempool_full_state.super_ValidationState<TxValidationResult>,
                           TX_MEMPOOL_POLICY,(string *)&args,&local_2f8);
                std::__cxx11::string::~string((string *)&local_2f8);
                std::__cxx11::string::~string((string *)&args);
                std::
                _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::erase(&results_final._M_t,&pWVar29->m_wrapped);
                ValidationState<TxValidationResult>::ValidationState
                          (&local_388,&mempool_full_state.super_ValidationState<TxValidationResult>)
                ;
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = (pointer)active_chainstate;
                state_03.super_ValidationState<TxValidationResult>._0_8_ = uStack_788;
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length
                     = (size_type)psVar30;
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)p_Var10;
                state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                     __return_storage_ptr__;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _0_4_ = uStack_760;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _4_4_ = local_75c;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)
                       coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity =
                     (size_type)
                     coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)&args,state_03);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results_final,pWVar29,(MempoolAcceptResult *)&args);
                MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&args);
                this = &local_388;
                goto LAB_0035dc7a;
              }
            }
          }
          else {
            std::
            map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            ::count(&results_final,&pWVar29->m_wrapped);
            pmVar24 = std::
                      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      ::at(&multi_submission_result.m_tx_results,&pWVar29->m_wrapped);
            if (pmVar24->m_result_type == VALID) {
              args.m_chainparams._0_1_ = 1;
              uVar11 = *(undefined8 *)(pWVar29->m_wrapped).super_base_blob<256U>.m_data._M_elems;
              uVar12 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 8);
              uVar13 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x10);
              uVar14 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x18);
              args._17_7_ = SUB87(uVar13,0);
              args.m_coins_to_uncache._0_1_ = (undefined1)((ulong)uVar13 >> 0x38);
              args.m_coins_to_uncache._1_7_ = (undefined7)uVar14;
              args.m_test_accept = SUB81((ulong)uVar14 >> 0x38,0);
              args.m_chainparams._1_7_ = (undefined7)uVar11;
              args.m_accept_time._0_1_ = (undefined1)((ulong)uVar11 >> 0x38);
              args.m_accept_time._1_7_ = SUB87(uVar12,0);
              args.m_bypass_limits = SUB81((ulong)uVar12 >> 0x38,0);
              bVar18 = CTxMemPool::exists((CTxMemPool *)
                                          state_dummy.super_ValidationState<BlockValidationResult>.
                                          _0_8_,(GenTxid *)&args);
              if (!bVar18) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&args,"transaction failed",(allocator<char> *)&local_2f8);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&mempool_full_state,"",&local_739);
                ValidationState<PackageValidationResult>::Invalid
                          ((ValidationState<PackageValidationResult> *)&multi_submission_result,
                           PCKG_TX,(string *)&args,(string *)&mempool_full_state);
                std::__cxx11::string::~string((string *)&mempool_full_state);
                std::__cxx11::string::~string((string *)&args);
                mempool_full_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_result =
                     TX_RESULT_UNSET;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                _M_dataplus._M_p =
                     (pointer)&mempool_full_state.super_ValidationState<TxValidationResult>.
                               m_reject_reason.field_2;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                _M_string_length = 0;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2
                ._M_local_buf[0] = '\0';
                mempool_full_state.super_ValidationState<TxValidationResult>.m_debug_message.
                _M_dataplus._M_p =
                     (pointer)&mempool_full_state.super_ValidationState<TxValidationResult>.
                               m_debug_message.field_2;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_debug_message.
                _M_string_length = 0;
                mempool_full_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2
                ._M_local_buf[0] = '\0';
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&args,"mempool full",&local_739);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f8,"",&local_73a);
                ValidationState<TxValidationResult>::Invalid
                          (&mempool_full_state.super_ValidationState<TxValidationResult>,
                           TX_MEMPOOL_POLICY,(string *)&args,&local_2f8);
                std::__cxx11::string::~string((string *)&local_2f8);
                std::__cxx11::string::~string((string *)&args);
                ValidationState<TxValidationResult>::ValidationState
                          (&local_340,&mempool_full_state.super_ValidationState<TxValidationResult>)
                ;
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = (pointer)active_chainstate;
                state_04.super_ValidationState<TxValidationResult>._0_8_ = uStack_788;
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length
                     = (size_type)psVar30;
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)p_Var10;
                state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                     __return_storage_ptr__;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _0_4_ = uStack_760;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _4_4_ = local_75c;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)
                       coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity =
                     (size_type)
                     coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)&args,state_04);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results_final,pWVar29,(MempoolAcceptResult *)&args);
                MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&args);
                this = &local_340;
LAB_0035dc7a:
                ValidationState<TxValidationResult>::~ValidationState(this);
                ValidationState<TxValidationResult>::~ValidationState
                          (&mempool_full_state.super_ValidationState<TxValidationResult>);
                goto LAB_0035dc8c;
              }
            }
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&results_final,pWVar29,pmVar24);
          }
LAB_0035dc8c:
        }
        ValidationState<PackageValidationResult>::ValidationState
                  ((ValidationState<PackageValidationResult> *)&args,
                   (ValidationState<PackageValidationResult> *)&multi_submission_result);
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)active_chainstate;
        state_05.super_ValidationState<PackageValidationResult>._0_8_ = uStack_788;
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)psVar30;
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)p_Var10;
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             __return_storage_ptr__;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _0_4_ = uStack_760;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _4_4_ = local_75c;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_start;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity =
             (size_type)
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_finish;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_05,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)&args);
        ValidationState<PackageValidationResult>::~ValidationState
                  ((ValidationState<PackageValidationResult> *)&args);
        PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&multi_submission_result);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&txns_package_eval);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree(&individual_results_nonfinal._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree(&results_final._M_t);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock9.super_unique_lock);
      }
      std::
      _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&unconfirmed_parent_txids._M_h);
    }
    else {
      ValidationState<PackageValidationResult>::ValidationState
                ((ValidationState<PackageValidationResult> *)&args,
                 &package_state_quit_early.super_ValidationState<PackageValidationResult>);
      psVar1 = &multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_ =
           M_VALID;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>._1_7_ = 0;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      ._M_dataplus._M_p._0_1_ = 0;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      ._M_dataplus._M_p._1_7_ = 0;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      ._M_string_length._0_1_ = 0;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      ._M_string_length._1_7_ = 0;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      .field_2._M_local_buf[0] = (char)psVar1;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      .field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)psVar1 >> 8);
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_debug_message
      ._M_dataplus._M_p = (pointer)0x0;
      state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)active_chainstate;
      state.super_ValidationState<PackageValidationResult>._0_8_ = uStack_788;
      state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
           (size_type)package;
      state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = local_770;
      state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
           __return_storage_ptr__;
      state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._0_4_ =
           uStack_760;
      state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._4_4_ =
           local_75c;
      state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
           (size_type)
           coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
      state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity =
           (size_type)
           coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
      state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
           coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      .field_2._M_local_buf[8] =
           multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
           m_reject_reason.field_2._M_local_buf[0];
      multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
      .field_2._9_7_ =
           multi_submission_result.m_state.super_ValidationState<PackageValidationResult>.
           m_reject_reason.field_2._M_allocated_capacity._1_7_;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)&args);
LAB_0035d18d:
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)&multi_submission_result);
      ValidationState<PackageValidationResult>::~ValidationState
                ((ValidationState<PackageValidationResult> *)&args);
    }
    ValidationState<PackageValidationResult>::~ValidationState
              (&package_state_quit_early.super_ValidationState<PackageValidationResult>);
    anon_unknown.dwarf_c1a4f9::MemPoolAccept::~MemPoolAccept((MemPoolAccept *)&state_dummy);
    hash = coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
    pCVar15 = coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((__return_storage_ptr__->m_state).super_ValidationState<PackageValidationResult>.m_mode !=
        M_INVALID) goto LAB_0035dd6a;
  }
  for (; hash != pCVar15; hash = hash + 1) {
    pCVar27 = Chainstate::CoinsTip(active_chainstate);
    CCoinsViewCache::Uncache(pCVar27,hash);
  }
LAB_0035dd6a:
  state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state_dummy.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state_dummy.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
       '\0';
  state_dummy.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state_dummy.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state_dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
       '\0';
  Chainstate::FlushStateToDisk(active_chainstate,&state_dummy,PERIODIC,0);
  ValidationState<BlockValidationResult>::~ValidationState
            (&state_dummy.super_ValidationState<BlockValidationResult>);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            (&coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

PackageMempoolAcceptResult ProcessNewPackage(Chainstate& active_chainstate, CTxMemPool& pool,
                                                   const Package& package, bool test_accept, const std::optional<CFeeRate>& client_maxfeerate)
{
    AssertLockHeld(cs_main);
    assert(!package.empty());
    assert(std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;}));

    std::vector<COutPoint> coins_to_uncache;
    const CChainParams& chainparams = active_chainstate.m_chainman.GetParams();
    auto result = [&]() EXCLUSIVE_LOCKS_REQUIRED(cs_main) {
        AssertLockHeld(cs_main);
        if (test_accept) {
            auto args = MemPoolAccept::ATMPArgs::PackageTestAccept(chainparams, GetTime(), coins_to_uncache);
            return MemPoolAccept(pool, active_chainstate).AcceptMultipleTransactions(package, args);
        } else {
            auto args = MemPoolAccept::ATMPArgs::PackageChildWithParents(chainparams, GetTime(), coins_to_uncache, client_maxfeerate);
            return MemPoolAccept(pool, active_chainstate).AcceptPackage(package, args);
        }
    }